

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

Vat * __thiscall
capnp::_::anon_unknown_0::TestContext::initVat<capnproto_test::capnp::test::TestInterface::Client>
          (TestContext *this,StringPtr name,Client *bootstrap)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  ClientHook *pCVar3;
  TestVat *network;
  Vat *pVVar4;
  Entry *pEVar5;
  RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> RVar6;
  Client local_58;
  Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t> local_40;
  
  network = TestNetwork::add(&this->network,name);
  pVVar4 = (Vat *)operator_new(0x18);
  p_Var2 = bootstrap->_vptr_Client[-3];
  pVVar4->vatNetwork = network;
  p_Var1 = (_func_int *)((long)&bootstrap->_vptr_Client + (long)p_Var2);
  local_58.hook.disposer = *(Disposer **)p_Var1;
  local_58.hook.ptr = *(ClientHook **)(p_Var1 + 8);
  *(undefined8 *)(&bootstrap->field_0x8 + (long)p_Var2) = 0;
  RVar6 = makeRpcServer<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestThirdPartyCompletion,capnproto_test::capnp::test::TestThirdPartyToAwait,capnproto_test::capnp::test::TestThirdPartyToContact,capnproto_test::capnp::test::TestJoinResult>
                    ((capnp *)&pVVar4->rpcSystem,&network->super_TestVatBase,&local_58);
  pCVar3 = local_58.hook.ptr;
  if (local_58.hook.ptr != (ClientHook *)0x0) {
    local_58.hook.ptr = (ClientHook *)0x0;
    (**(local_58.hook.disposer)->_vptr_Disposer)
              (local_58.hook.disposer,
               (_func_int *)((long)&pCVar3->_vptr_ClientHook + (long)pCVar3->_vptr_ClientHook[-2]),
               RVar6.super_RpcSystemBase.impl.ptr);
  }
  local_40.disposer =
       (Disposer *)&kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestContext::Vat>::instance
  ;
  local_40.ptr = pVVar4;
  pEVar5 = kj::
           HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>_>
           ::insert(&this->vats,name,&local_40);
  pVVar4 = (pEVar5->value).ptr;
  if (local_40.ptr != (Vat *)0x0) {
    (**(local_40.disposer)->_vptr_Disposer)();
  }
  return pVVar4;
}

Assistant:

Vat& initVat(kj::StringPtr name, T bootstrap) {
    // Create a vat with the given name and bootstrap capability.
    return *vats.insert(name, kj::heap<Vat>(network.add(name), kj::mv(bootstrap))).value;
  }